

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlstring.c
# Opt level: O2

int xmlUTF8Size(xmlChar *utf)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  
  iVar2 = -1;
  iVar3 = iVar2;
  if (utf != (xmlChar *)0x0) {
    bVar1 = *utf;
    if (-1 < (char)bVar1) {
      return 1;
    }
    if ((bVar1 & 0x40) != 0) {
      iVar4 = 2;
      for (uVar5 = 0x20; (iVar3 = iVar2, iVar4 != 8 && (iVar3 = iVar4, (uVar5 & bVar1) != 0));
          uVar5 = uVar5 >> 1) {
        iVar4 = iVar4 + 1;
      }
    }
  }
  return iVar3;
}

Assistant:

int
xmlUTF8Size(const xmlChar *utf) {
    xmlChar mask;
    int len;

    if (utf == NULL)
        return -1;
    if (*utf < 0x80)
        return 1;
    /* check valid UTF8 character */
    if (!(*utf & 0x40))
        return -1;
    /* determine number of bytes in char */
    len = 2;
    for (mask=0x20; mask != 0; mask>>=1) {
        if (!(*utf & mask))
            return len;
        len++;
    }
    return -1;
}